

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::enter_2D_GL_draw_mode(Application *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (int)this->screenW;
  iVar2 = (int)this->screenH;
  glPushAttrib(0x800);
  glViewport(0,0,iVar1,iVar2);
  glMatrixMode(0x1701);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0,(double)iVar1,(double)iVar2,0,0,0x3ff0000000000000);
  glMatrixMode(0x1700);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0,0,0xbf800000);
  glDisable(0xb71);
  glDisable(0xb50);
  return;
}

Assistant:

void Application::enter_2D_GL_draw_mode()
{
  int screen_w = screenW;
  int screen_h = screenH;
  glPushAttrib( GL_VIEWPORT_BIT );
  glViewport( 0, 0, screen_w, screen_h );
  glMatrixMode( GL_PROJECTION );
  glPushMatrix();
  glLoadIdentity();
  glOrtho( 0, screen_w, screen_h, 0, 0, 1 ); // Y flipped !
  glMatrixMode( GL_MODELVIEW );
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0, 0, -1);
  glDisable(GL_DEPTH_TEST);
  glDisable(GL_LIGHTING);
}